

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

NULLCRef * NULLC::CopyObject(NULLCRef ptr)

{
  uint size;
  char *__dest;
  NULLCRef *in_RDI;
  uint in_stack_00000008;
  void *in_stack_0000000c;
  
  in_RDI->typeID = in_stack_00000008;
  if (in_stack_00000008 < *(uint *)(linker + 0x20c)) {
    size = *(uint *)(*(long *)(linker + 0x200) + 4 + (ulong)in_stack_00000008 * 0x50);
    __dest = (char *)AllocObject(size,in_stack_00000008);
    in_RDI->ptr = __dest;
    memcpy(__dest,in_stack_0000000c,(ulong)size);
    return in_RDI;
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,
                "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

NULLCRef NULLC::CopyObject(NULLCRef ptr)
{
	NULLCRef ret;
	ret.typeID = ptr.typeID;
	unsigned int objSize = linker->exTypes[ret.typeID].size;
	ret.ptr = (char*)AllocObject(objSize, ptr.typeID);
	memcpy(ret.ptr, ptr.ptr, objSize);
	return ret;
}